

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

NETSOCKET net_udp_create(NETADDR bindaddr,int use_random_port)

{
  long lVar1;
  NETADDR NVar2;
  uint __fd;
  int __fd_00;
  ulong uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  NETSOCKET NVar5;
  NETSOCKET sock;
  int recvsize;
  int broadcast;
  sockaddr_in addr;
  NETADDR tmpbindaddr;
  
  NVar2 = bindaddr;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0xffffffff00000000;
  tmpbindaddr.ip[0xc] = bindaddr.ip[0xc];
  tmpbindaddr.ip[0xd] = bindaddr.ip[0xd];
  tmpbindaddr.ip[0xe] = bindaddr.ip[0xe];
  tmpbindaddr.ip[0xf] = bindaddr.ip[0xf];
  tmpbindaddr.port = bindaddr.port;
  tmpbindaddr.reserved = bindaddr.reserved;
  tmpbindaddr._0_8_ = NVar2._0_8_;
  tmpbindaddr.ip[4] = bindaddr.ip[4];
  tmpbindaddr.ip[5] = bindaddr.ip[5];
  tmpbindaddr.ip[6] = bindaddr.ip[6];
  tmpbindaddr.ip[7] = bindaddr.ip[7];
  tmpbindaddr.ip[8] = bindaddr.ip[8];
  tmpbindaddr.ip[9] = bindaddr.ip[9];
  tmpbindaddr.ip[10] = bindaddr.ip[10];
  tmpbindaddr.ip[0xb] = bindaddr.ip[0xb];
  broadcast = 1;
  recvsize = 0x10000;
  uVar4 = 0;
  if (((undefined1  [24])NVar2 & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
    tmpbindaddr.ip._0_4_ = NVar2.ip._0_4_;
    tmpbindaddr.type = 1;
    netaddr_to_sockaddr_in(&tmpbindaddr,&addr);
    __fd = priv_net_create_socket(2,2,(sockaddr *)&addr,0x10,use_random_port);
    if ((int)__fd < 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = 1;
      setsockopt(__fd,1,6,&broadcast,4);
      setsockopt(__fd,1,8,&recvsize,4);
      uVar3 = (ulong)__fd << 0x20;
    }
  }
  if (((undefined1  [24])NVar2 & (undefined1  [24])0x2) == (undefined1  [24])0x0) {
    __fd_00 = -1;
  }
  else {
    tmpbindaddr.type = 2;
    netaddr_to_sockaddr_in6(&tmpbindaddr,(sockaddr_in6 *)&addr);
    __fd_00 = priv_net_create_socket(10,2,(sockaddr *)&addr,0x1c,use_random_port);
    if (-1 < __fd_00) {
      uVar4 = uVar4 | 2;
      setsockopt(__fd_00,1,6,&broadcast,4);
      setsockopt(__fd_00,1,8,&recvsize,4);
    }
  }
  uVar3 = uVar3 | uVar4;
  sock.ipv6sock = __fd_00;
  sock.type = (int)uVar3;
  sock.ipv4sock = (int)(uVar3 >> 0x20);
  net_set_non_blocking(sock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    NVar5.ipv6sock = __fd_00;
    NVar5.type = (int)uVar3;
    NVar5.ipv4sock = (int)(uVar3 >> 0x20);
    return NVar5;
  }
  __stack_chk_fail();
}

Assistant:

NETSOCKET net_udp_create(NETADDR bindaddr, int use_random_port)
{
	NETSOCKET sock = invalid_socket;
	NETADDR tmpbindaddr = bindaddr;
	int broadcast = 1;
	int recvsize = 65536;

	if(bindaddr.type&NETTYPE_IPV4)
	{
		struct sockaddr_in addr;
		int socket = -1;

		/* bind, we should check for error */
		tmpbindaddr.type = NETTYPE_IPV4;
		netaddr_to_sockaddr_in(&tmpbindaddr, &addr);
		socket = priv_net_create_socket(AF_INET, SOCK_DGRAM, (struct sockaddr *)&addr, sizeof(addr), use_random_port);
		if(socket >= 0)
		{
			sock.type |= NETTYPE_IPV4;
			sock.ipv4sock = socket;

			/* set broadcast */
			setsockopt(socket, SOL_SOCKET, SO_BROADCAST, (const char*)&broadcast, sizeof(broadcast));

			/* set receive buffer size */
			setsockopt(socket, SOL_SOCKET, SO_RCVBUF, (char*)&recvsize, sizeof(recvsize));
		}
	}

	if(bindaddr.type&NETTYPE_IPV6)
	{
		struct sockaddr_in6 addr;
		int socket = -1;

		/* bind, we should check for error */
		tmpbindaddr.type = NETTYPE_IPV6;
		netaddr_to_sockaddr_in6(&tmpbindaddr, &addr);
		socket = priv_net_create_socket(AF_INET6, SOCK_DGRAM, (struct sockaddr *)&addr, sizeof(addr), use_random_port);
		if(socket >= 0)
		{
			sock.type |= NETTYPE_IPV6;
			sock.ipv6sock = socket;

			/* set broadcast */
			setsockopt(socket, SOL_SOCKET, SO_BROADCAST, (const char*)&broadcast, sizeof(broadcast));

			/* set receive buffer size */
			setsockopt(socket, SOL_SOCKET, SO_RCVBUF, (char*)&recvsize, sizeof(recvsize));
		}
	}

	/* set non-blocking */
	net_set_non_blocking(sock);

	/* return */
	return sock;
}